

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O1

bool __thiscall
Assimp::IOStreamBuffer<char>::getNextDataLine
          (IOStreamBuffer<char> *this,vector<char,_std::allocator<char>_> *buffer,
          char continuationToken)

{
  char cVar1;
  pointer pcVar2;
  size_t sVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  undefined4 extraout_var_00;
  long lVar6;
  bool bVar7;
  
  std::vector<char,_std::allocator<char>_>::resize(buffer,this->m_cacheSize);
  if (this->m_filePos == 0 || this->m_cacheSize <= this->m_cachePos) {
    (*this->m_stream->_vptr_IOStream[4])(this->m_stream,this->m_filePos,0);
    iVar4 = (*this->m_stream->_vptr_IOStream[2])
                      (this->m_stream,
                       (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,1,this->m_cacheSize);
    uVar5 = CONCAT44(extraout_var,iVar4);
    if (uVar5 == 0) {
      return false;
    }
    if (uVar5 < this->m_cacheSize) {
      this->m_cacheSize = uVar5;
    }
    this->m_filePos = this->m_filePos + this->m_cacheSize;
    this->m_blockIdx = this->m_blockIdx + 1;
    this->m_cachePos = 0;
    if (uVar5 == 0) {
      return false;
    }
  }
  bVar7 = false;
  lVar6 = 0;
  while( true ) {
    pcVar2 = (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar2[this->m_cachePos] == continuationToken) {
      this->m_cachePos = this->m_cachePos + 1;
      bVar7 = true;
    }
    if (((byte)pcVar2[this->m_cachePos] < 0xe) &&
       ((0x3401U >> ((byte)pcVar2[this->m_cachePos] & 0x1f) & 1) != 0)) {
      if (!bVar7) break;
      cVar1 = pcVar2[this->m_cachePos];
      sVar3 = this->m_cachePos;
      while (cVar1 != '\n') {
        this->m_cachePos = sVar3 + 1;
        cVar1 = pcVar2[sVar3 + 1];
        sVar3 = sVar3 + 1;
      }
      this->m_cachePos = sVar3 + 1;
      bVar7 = false;
    }
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar6] = pcVar2[this->m_cachePos];
    uVar5 = this->m_cachePos + 1;
    this->m_cachePos = uVar5;
    lVar6 = lVar6 + 1;
    if (this->m_filesize <= uVar5) break;
    if (this->m_cacheSize <= uVar5) {
      (*this->m_stream->_vptr_IOStream[4])(this->m_stream,this->m_filePos,0);
      iVar4 = (*this->m_stream->_vptr_IOStream[2])
                        (this->m_stream,
                         (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,1,this->m_cacheSize);
      uVar5 = CONCAT44(extraout_var_00,iVar4);
      if (uVar5 == 0) {
        return false;
      }
      if (uVar5 < this->m_cacheSize) {
        this->m_cacheSize = uVar5;
      }
      this->m_filePos = this->m_filePos + this->m_cacheSize;
      this->m_blockIdx = this->m_blockIdx + 1;
      this->m_cachePos = 0;
      if (uVar5 == 0) {
        return false;
      }
    }
  }
  (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [lVar6] = '\n';
  this->m_cachePos = this->m_cachePos + 1;
  return true;
}

Assistant:

AI_FORCE_INLINE
bool IOStreamBuffer<T>::getNextDataLine( std::vector<T> &buffer, T continuationToken ) {
    buffer.resize( m_cacheSize );
    if ( m_cachePos >= m_cacheSize || 0 == m_filePos ) {
        if ( !readNextBlock() ) {
            return false;
        }
    }

    bool continuationFound( false );
    size_t i = 0;
    for( ;; ) {
        if ( continuationToken == m_cache[ m_cachePos ] ) {
            continuationFound = true;
            ++m_cachePos;
        }
        if ( IsLineEnd( m_cache[ m_cachePos ] ) ) {
            if ( !continuationFound ) {
                // the end of the data line
                break;
            } else {
                // skip line end
                while ( m_cache[m_cachePos] != '\n') {
                    ++m_cachePos;
                }
                ++m_cachePos;
                continuationFound = false;
            }
        }

        buffer[ i ] = m_cache[ m_cachePos ];
        ++m_cachePos;
        ++i;
        if (m_cachePos >= size()) {
            break;
        }
        if ( m_cachePos >= m_cacheSize ) {
            if ( !readNextBlock() ) {
                return false;
            }
        }
    }
    
    buffer[ i ] = '\n';
    ++m_cachePos;

    return true;
}